

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t48(void)

{
  byte bVar1;
  undefined8 uVar2;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  ALLEGRO_USTR *us1;
  ALLEGRO_USTR_INFO i1;
  undefined1 local_10 [16];
  
  uVar2 = al_ref_cstr(local_10,anon_var_dwarf_1343);
  bVar1 = al_ustr_has_prefix_cstr(uVar2,"");
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_has_prefix_cstr(us1, \"\")");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_has_prefix_cstr(us1, \"\")");
  }
  bVar1 = al_ustr_has_prefix_cstr(uVar2,anon_var_dwarf_146f);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n",anon_var_dwarf_147b);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_147b);
  }
  bVar1 = al_ustr_has_prefix_cstr(uVar2,anon_var_dwarf_1487);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    log_printf("FAIL %s\n",anon_var_dwarf_1493);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_1493);
  }
  bVar1 = al_ustr_has_suffix_cstr(uVar2,"");
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n","al_ustr_has_suffix_cstr(us1, \"\")");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_has_suffix_cstr(us1, \"\")");
  }
  bVar1 = al_ustr_has_suffix_cstr(uVar2,anon_var_dwarf_1343 + 10);
  if ((bVar1 & 1) == 0) {
    log_printf("FAIL %s\n",anon_var_dwarf_14b7);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_14b7);
  }
  bVar1 = al_ustr_has_suffix_cstr(uVar2,anon_var_dwarf_1487);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    log_printf("FAIL %s\n",anon_var_dwarf_14c3);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_14c3);
  }
  return;
}

Assistant:

static void t48(void)
{
   ALLEGRO_USTR_INFO i1;
   const ALLEGRO_USTR *us1 = al_ref_cstr(&i1, "Thú mỏ vịt");

   /* The _cstr versions are simple wrappers around the real functions so its
    * okay to test them only.
    */

   CHECK(al_ustr_has_prefix_cstr(us1, ""));
   CHECK(al_ustr_has_prefix_cstr(us1, "Thú"));
   CHECK(! al_ustr_has_prefix_cstr(us1, "Thú mỏ vịt."));

   CHECK(al_ustr_has_suffix_cstr(us1, ""));
   CHECK(al_ustr_has_suffix_cstr(us1, "vịt"));
   CHECK(! al_ustr_has_suffix_cstr(us1, "Thú mỏ vịt."));
}